

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_strmatch_fuzzy_text(char *str,int str_len,char *pattern,int *out_score)

{
  char cVar1;
  char cVar2;
  ulong uVar3;
  byte bVar4;
  bool bVar5;
  ulong uVar6;
  int iVar7;
  char *pcVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  char *pcVar16;
  int iVar17;
  int iVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  
  if (str == (char *)0x0) {
    __assert_fail("str",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x1a0a,"int nk_strmatch_fuzzy_text(const char *, int, const char *, int *)");
  }
  if (pattern == (char *)0x0) {
    __assert_fail("pattern",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x1a0b,"int nk_strmatch_fuzzy_text(const char *, int, const char *, int *)");
  }
  if (str_len == 0) {
    uVar14 = 0;
  }
  else {
    uVar6 = 0;
    uVar11 = (ulong)(uint)str_len;
    if (str_len < 1) {
      uVar11 = uVar6;
    }
    bVar22 = true;
    pcVar8 = (char *)0x0;
    bVar19 = false;
    bVar4 = 0;
    iVar10 = 0;
    pcVar16 = pattern;
    uVar9 = 0;
    for (; uVar11 * 3 + uVar6 != 0; uVar6 = uVar6 - 3) {
      cVar1 = *pcVar16;
      iVar13 = (int)cVar1;
      bVar21 = false;
      cVar2 = *str;
      iVar17 = (int)cVar2;
      if (cVar1 == '\0') {
        bVar20 = false;
      }
      else {
        iVar15 = iVar13 + -0xa2;
        if (0x19 < iVar13 - 0x41U) {
          iVar15 = iVar13;
        }
        iVar7 = iVar17 + -0xa2;
        if (0x19 < iVar17 - 0x41U) {
          iVar7 = iVar17;
        }
        bVar20 = iVar15 == iVar7;
      }
      uVar14 = uVar9;
      if (pcVar8 == (char *)0x0) {
        pcVar8 = (char *)0x0;
LAB_00105b22:
        uVar9 = 0;
      }
      else {
        iVar7 = (int)*pcVar8;
        iVar15 = iVar7 + -0x20;
        if (0x19 < iVar7 - 0x61U) {
          iVar15 = iVar7;
        }
        iVar18 = iVar17 + -0x20;
        if (0x19 < iVar17 - 0x61U) {
          iVar18 = iVar17;
        }
        bVar21 = iVar15 == iVar18;
        bVar5 = bVar20;
        if (cVar1 != '\0') {
          iVar15 = iVar7 + -0xa2;
          if (0x19 < iVar7 - 0x41U) {
            iVar15 = iVar7;
          }
          iVar7 = iVar13 + -0xa2;
          if (0x19 < iVar13 - 0x41U) {
            iVar7 = iVar13;
          }
          bVar5 = (bool)(iVar15 == iVar7 | bVar20);
        }
        if (bVar5 == false) goto LAB_00105b22;
        pcVar8 = (char *)0x0;
        uVar14 = 0;
        if (bVar5 == false) goto LAB_00105b22;
      }
      iVar10 = uVar9 + iVar10;
      if (bVar21 || bVar20 != false) {
        if (pcVar16 == pattern) {
          uVar3 = 0xfffffffffffffff7;
          if (-9 < (int)uVar6) {
            uVar3 = uVar6;
          }
          iVar10 = iVar10 + (int)uVar3;
        }
        uVar9 = (uint)bVar4 * 5 + 10;
        if (!bVar22) {
          uVar9 = (uint)bVar4 * 5;
        }
        uVar12 = uVar9 + 10;
        if (iVar17 - 0x5bU < 0xffffffe6) {
          uVar12 = uVar9;
        }
        if (!bVar19) {
          uVar12 = uVar9;
        }
        pcVar16 = pcVar16 + bVar20;
        bVar22 = pcVar8 != (char *)0x0;
        bVar19 = uVar14 <= uVar12;
        if (uVar14 <= uVar12) {
          pcVar8 = str;
        }
        if (uVar14 < uVar12) {
          uVar14 = uVar12;
        }
        iVar10 = iVar10 - (uint)(bVar19 && bVar22);
        bVar4 = 1;
      }
      else {
        iVar10 = iVar10 + -1;
        bVar4 = 0;
      }
      bVar19 = iVar17 - 0x61U < 0x1a;
      bVar22 = cVar2 == ' ' || cVar2 == '_';
      str = str + 1;
      uVar9 = uVar14;
    }
    uVar14 = 0;
    if (pcVar8 == (char *)0x0) {
      uVar9 = uVar14;
    }
    if ((*pcVar16 == '\0') && (uVar14 = 1, out_score != (int *)0x0)) {
      *out_score = iVar10 + uVar9;
    }
  }
  return uVar14;
}

Assistant:

NK_API int
nk_strmatch_fuzzy_text(const char *str, int str_len,
    const char *pattern, int *out_score)
{
    /* Returns true if each character in pattern is found sequentially within str
     * if found then out_score is also set. Score value has no intrinsic meaning.
     * Range varies with pattern. Can only compare scores with same search pattern. */

    /* bonus for adjacent matches */
    #define NK_ADJACENCY_BONUS 5
    /* bonus if match occurs after a separator */
    #define NK_SEPARATOR_BONUS 10
    /* bonus if match is uppercase and prev is lower */
    #define NK_CAMEL_BONUS 10
    /* penalty applied for every letter in str before the first match */
    #define NK_LEADING_LETTER_PENALTY (-3)
    /* maximum penalty for leading letters */
    #define NK_MAX_LEADING_LETTER_PENALTY (-9)
    /* penalty for every letter that doesn't matter */
    #define NK_UNMATCHED_LETTER_PENALTY (-1)

    /* loop variables */
    int score = 0;
    char const * pattern_iter = pattern;
    int str_iter = 0;
    int prev_matched = nk_false;
    int prev_lower = nk_false;
    /* true so if first letter match gets separator bonus*/
    int prev_separator = nk_true;

    /* use "best" matched letter if multiple string letters match the pattern */
    char const * best_letter = 0;
    int best_letter_score = 0;

    /* loop over strings */
    NK_ASSERT(str);
    NK_ASSERT(pattern);
    if (!str || !str_len || !pattern) return 0;
    while (str_iter < str_len)
    {
        const char pattern_letter = *pattern_iter;
        const char str_letter = str[str_iter];

        int next_match = *pattern_iter != '\0' &&
            nk_to_lower(pattern_letter) == nk_to_lower(str_letter);
        int rematch = best_letter && nk_to_upper(*best_letter) == nk_to_upper(str_letter);

        int advanced = next_match && best_letter;
        int pattern_repeat = best_letter && *pattern_iter != '\0';
        pattern_repeat = pattern_repeat &&
            nk_to_lower(*best_letter) == nk_to_lower(pattern_letter);

        if (advanced || pattern_repeat) {
            score += best_letter_score;
            best_letter = 0;
            best_letter_score = 0;
        }

        if (next_match || rematch)
        {
            int new_score = 0;
            /* Apply penalty for each letter before the first pattern match */
            if (pattern_iter == pattern) {
                int count = (int)(&str[str_iter] - str);
                int penalty = NK_LEADING_LETTER_PENALTY * count;
                if (penalty < NK_MAX_LEADING_LETTER_PENALTY)
                    penalty = NK_MAX_LEADING_LETTER_PENALTY;

                score += penalty;
            }

            /* apply bonus for consecutive bonuses */
            if (prev_matched)
                new_score += NK_ADJACENCY_BONUS;

            /* apply bonus for matches after a separator */
            if (prev_separator)
                new_score += NK_SEPARATOR_BONUS;

            /* apply bonus across camel case boundaries */
            if (prev_lower && nk_is_upper(str_letter))
                new_score += NK_CAMEL_BONUS;

            /* update pattern iter IFF the next pattern letter was matched */
            if (next_match)
                ++pattern_iter;

            /* update best letter in str which may be for a "next" letter or a rematch */
            if (new_score >= best_letter_score) {
                /* apply penalty for now skipped letter */
                if (best_letter != 0)
                    score += NK_UNMATCHED_LETTER_PENALTY;

                best_letter = &str[str_iter];
                best_letter_score = new_score;
            }
            prev_matched = nk_true;
        } else {
            score += NK_UNMATCHED_LETTER_PENALTY;
            prev_matched = nk_false;
        }

        /* separators should be more easily defined */
        prev_lower = nk_is_lower(str_letter) != 0;
        prev_separator = str_letter == '_' || str_letter == ' ';

        ++str_iter;
    }

    /* apply score for last match */
    if (best_letter)
        score += best_letter_score;

    /* did not match full pattern */
    if (*pattern_iter != '\0')
        return nk_false;

    if (out_score)
        *out_score = score;
    return nk_true;
}